

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECParameters.cpp
# Opt level: O3

bool __thiscall ECParameters::deserialise(ECParameters *this,ByteString *serialised)

{
  size_t sVar1;
  ByteString dEC;
  ByteString local_38;
  
  ByteString::chainDeserialise(&local_38,serialised);
  sVar1 = ByteString::size(&local_38);
  if (sVar1 != 0) {
    ByteString::operator=(&this->ec,&local_38);
  }
  local_38._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_38.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return sVar1 != 0;
}

Assistant:

bool ECParameters::deserialise(ByteString& serialised)
{
	ByteString dEC = ByteString::chainDeserialise(serialised);

	if (dEC.size() == 0)
	{
		return false;
	}

	setEC(dEC);

	return true;
}